

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O2

_Bool allocate(int b,inform_dist **x,inform_dist **y,inform_error *err)

{
  inform_dist *piVar1;
  
  piVar1 = inform_dist_alloc((long)b);
  *x = piVar1;
  if (piVar1 != (inform_dist *)0x0) {
    piVar1 = inform_dist_alloc((long)b);
    *y = piVar1;
    if (piVar1 != (inform_dist *)0x0) {
      return false;
    }
    inform_dist_free(*x);
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return true;
}

Assistant:

inline static bool allocate(int bx, int by, inform_dist **x, inform_dist **xy,
    inform_error *err)
{
    if ((*x = inform_dist_alloc(bx)) == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, true);
    }
    if ((*xy = inform_dist_alloc(bx * by)) == NULL)
    {
        inform_dist_free(*x);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, true);
    }
    return false;
}